

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O1

void __thiscall ThreadPoolMonoid::ThreadPoolMonoid(ThreadPoolMonoid *this)

{
  list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *plVar1;
  
  (this->_pool)._worker.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_pool)._worker.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_pool)._worker.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_pool)._run.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_pool)._run.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_pool)._run.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_pool)._exit.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_pool)._exit.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_pool)._exit.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::condition_variable::condition_variable(&(this->_pool)._waiting);
  (this->_pool)._creation.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_pool)._creation.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_pool)._creation.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_pool)._creation.super___mutex_base._M_mutex + 0x10) = 0;
  (this->_pool)._creation.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->_pool)._completeCreation);
  plVar1 = &(this->_pool)._task;
  (this->_pool)._task.
  super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->_pool)._task.
  super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->_pool)._task.
  super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->_pool)._taskInfo.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_pool)._taskInfo.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_pool)._taskInfo.super___mutex_base._M_mutex + 0x10) = 0;
  *(undefined8 *)((long)&(this->_pool)._taskInfo.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_pool)._taskInfo.super___mutex_base._M_mutex + 0x10) = 0;
  (this->_pool)._taskInfo.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_pool)._taskInfo.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

ThreadPoolMonoid() { }